

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeliefValue.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
BeliefValue::GetValues
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,
          BeliefSetNonStationary *Beliefs,QFunctionsDiscreteNonStationary *Q)

{
  pointer pvVar1;
  pointer pdVar2;
  size_t __n;
  ulong uVar3;
  pointer pvVar4;
  ulong uVar5;
  int iVar6;
  vector<double,_std::allocator<double>_> valuesT;
  vector<double,_std::allocator<double>_> local_48;
  
  __n = BeliefSetNonStationary::Size(Beliefs);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,__n,(allocator_type *)&local_48);
  pvVar4 = (Q->
           super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((Q->
      super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pvVar4) {
    uVar5 = 0;
    iVar6 = 0;
    do {
      pvVar1 = (Beliefs->_m_beliefSets).
               super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)(Beliefs->_m_beliefSets).
                     super__Vector_base<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>,_std::allocator<std::vector<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
              -0x5555555555555555;
      if (uVar3 < uVar5 || uVar3 - uVar5 == 0) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5
                   ,uVar3);
      }
      GetValues(&local_48,pvVar1 + uVar5,pvVar4 + uVar5);
      if ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        pdVar2 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        uVar3 = 0;
        do {
          pdVar2[(uint)(iVar6 + (int)uVar3)] =
               local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3];
          uVar3 = uVar3 + 1;
        } while ((long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3 != (uVar3 & 0xffffffff));
        iVar6 = iVar6 + (int)uVar3;
      }
      if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
      pvVar4 = (Q->
               super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (((long)(Q->
                    super__Vector_base<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>,_std::allocator<std::vector<std::vector<AlphaVector,_std::allocator<AlphaVector>_>,_std::allocator<std::vector<AlphaVector,_std::allocator<AlphaVector>_>_>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar4 >> 3) *
             -0x5555555555555555 - uVar5 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

vector<double> BeliefValue::GetValues(const BeliefSetNonStationary &Beliefs,
                                      const QFunctionsDiscreteNonStationary &Q)
{
    vector<double> values(Beliefs.Size());
    Index i=0;
    for(Index t=0;t!=Q.size();++t)
    {
        vector<double> valuesT=GetValues(Beliefs.Get(t),
                                         Q[t]);
        for(Index k=0;k!=valuesT.size();++k)
        {
            values[i]=valuesT[k];
            i++;
        }
    }
    return(values);
}